

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyParseTitle(TidyDocImpl *doc,Node *title,GetTokenMode mode)

{
  Node *pNVar1;
  Bool BVar2;
  Node *node;
  Node **ppNVar3;
  
  node = prvTidyGetToken(doc,MixedContent);
  if (node != (Node *)0x0) {
    do {
      if (node->tag == title->tag) {
        if (node->type != StartTag) {
          if (node->type == EndTag) {
            prvTidyFreeNode(doc,node);
            title->closed = yes;
            goto LAB_0012ab79;
          }
          goto LAB_0012aa95;
        }
        if (*(int *)((doc->config).value + 0x15) == 0) goto LAB_0012aa95;
        prvTidyReportError(doc,title,node,0xe0);
        node->type = EndTag;
        prvTidyUngetToken(doc);
      }
      else {
LAB_0012aa95:
        BVar2 = prvTidynodeIsText(node);
        if (BVar2 == no) {
          BVar2 = InsertMisc(title,node);
          if (BVar2 == no) {
            if (node->tag != (Dict *)0x0) {
              prvTidyReportError(doc,title,node,0xcf);
              prvTidyUngetToken(doc);
LAB_0012ab79:
              TrimSpaces(doc,title);
              return;
            }
            prvTidyReportError(doc,title,node,0xd0);
            goto LAB_0012ab09;
          }
        }
        else {
          if (title->content == (Node *)0x0) {
            TrimInitialSpace((TidyDocImpl *)doc->lexer,title,node);
          }
          if (node->start < node->end) {
            node->parent = title;
            pNVar1 = title->last;
            node->prev = pNVar1;
            ppNVar3 = &pNVar1->next;
            if (pNVar1 == (Node *)0x0) {
              ppNVar3 = &title->content;
            }
            *ppNVar3 = node;
            title->last = node;
          }
          else {
LAB_0012ab09:
            prvTidyFreeNode(doc,node);
          }
        }
      }
      node = prvTidyGetToken(doc,MixedContent);
    } while (node != (Node *)0x0);
  }
  prvTidyReportError(doc,title,(Node *)0x0,0xce);
  return;
}

Assistant:

void TY_(ParseTitle)(TidyDocImpl* doc, Node *title, GetTokenMode ARG_UNUSED(mode))
{
    Node *node;
    while ((node = TY_(GetToken)(doc, MixedContent)) != NULL)
    {
        if (node->tag == title->tag && node->type == StartTag
            && cfgBool(doc, TidyCoerceEndTags) )
        {
            TY_(ReportError)(doc, title, node, COERCE_TO_ENDTAG);
            node->type = EndTag;
            TY_(UngetToken)( doc );
            continue;
        }
        else if (node->tag == title->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            title->closed = yes;
            TrimSpaces(doc, title);
            return;
        }

        if (TY_(nodeIsText)(node))
        {
            /* only called for 1st child */
            if (title->content == NULL)
                TrimInitialSpace(doc, title, node);

            if (node->start >= node->end)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            TY_(InsertNodeAtEnd)(title, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(title, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(ReportError)(doc, title, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* pushback unexpected tokens */
        TY_(ReportError)(doc, title, node, MISSING_ENDTAG_BEFORE);
        TY_(UngetToken)( doc );
        TrimSpaces(doc, title);
        return;
    }

    TY_(ReportError)(doc, title, node, MISSING_ENDTAG_FOR);
}